

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy_s.c
# Opt level: O0

errno_t memcpy_s(void *dst,size_t sizeInBytes,void *src,size_t count)

{
  int *piVar1;
  int _Expr_val_2;
  int _Expr_val_1;
  int _Expr_val;
  size_t count_local;
  void *src_local;
  size_t sizeInBytes_local;
  void *dst_local;
  
  if (count == 0) {
    dst_local._4_4_ = 0;
  }
  else {
    if ((dst == (void *)0x0) && (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0)) {
      (*sMBUSafeCRTAssertFunc)
                ("_CRT_WIDE(\"dst != NULL\")","SafeCRT assert failed",
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/memcpy_s.c"
                 ,0x42);
    }
    if (dst != (void *)0x0) {
      if ((src == (void *)0x0) || (sizeInBytes < count)) {
        memset(dst,0,sizeInBytes);
        if ((src == (void *)0x0) && (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0)) {
          (*sMBUSafeCRTAssertFunc)
                    ("_CRT_WIDE(\"src != NULL\")","SafeCRT assert failed",
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/memcpy_s.c"
                     ,0x48);
        }
        if (src != (void *)0x0) {
          if ((count > sizeInBytes) && (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0)) {
            (*sMBUSafeCRTAssertFunc)
                      ("_CRT_WIDE(\"sizeInBytes >= count\")","SafeCRT assert failed",
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/memcpy_s.c"
                       ,0x49);
          }
          if (count <= sizeInBytes) {
            dst_local._4_4_ = 0x16;
          }
          else {
            piVar1 = __errno_location();
            *piVar1 = 0x22;
            if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0) {
              (*sMBUSafeCRTAssertFunc)
                        ("_CRT_WIDE(\"sizeInBytes >= count\")","SafeCRT assert failed",
                         "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/memcpy_s.c"
                         ,0x49);
            }
            dst_local._4_4_ = 0x22;
          }
        }
        else {
          piVar1 = __errno_location();
          *piVar1 = 0x16;
          if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0) {
            (*sMBUSafeCRTAssertFunc)
                      ("_CRT_WIDE(\"src != NULL\")","SafeCRT assert failed",
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/memcpy_s.c"
                       ,0x48);
          }
          dst_local._4_4_ = 0x16;
        }
      }
      else {
        memcpy(dst,src,count);
        dst_local._4_4_ = 0;
      }
    }
    else {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0) {
        (*sMBUSafeCRTAssertFunc)
                  ("_CRT_WIDE(\"dst != NULL\")","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/memcpy_s.c"
                   ,0x42);
      }
      dst_local._4_4_ = 0x16;
    }
  }
  return dst_local._4_4_;
}

Assistant:

errno_t __cdecl memcpy_s(
    void * dst,
    size_t sizeInBytes,
    const void * src,
    size_t count
)
{
    if (count == 0)
    {
        /* nothing to do */
        return 0;
    }

    /* validation section */
    _VALIDATE_RETURN_ERRCODE(dst != NULL, EINVAL);
    if (src == NULL || sizeInBytes < count)
    {
        /* zeroes the destination buffer */
        memset(dst, 0, sizeInBytes);

        _VALIDATE_RETURN_ERRCODE(src != NULL, EINVAL);
        _VALIDATE_RETURN_ERRCODE(sizeInBytes >= count, ERANGE);
        /* useless, but prefast is confused */
        return EINVAL;
    }

    memcpy(dst, src, count);
    return 0;
}